

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.c
# Opt level: O0

int bech32_encode(char *output,char *hrp,uint8_t *data,size_t data_len,size_t max_input_len,
                 _Bool is_bech32m)

{
  int iVar1;
  uint32_t uVar2;
  uint uVar3;
  ulong uStack_48;
  int ch;
  size_t i;
  uint32_t chk;
  _Bool is_bech32m_local;
  size_t max_input_len_local;
  size_t data_len_local;
  uint8_t *data_local;
  char *hrp_local;
  char *output_local;
  
  i._0_4_ = 1;
  uStack_48 = 0;
  while( true ) {
    if (hrp[uStack_48] == '\0') {
      if (max_input_len < uStack_48 + 7 + data_len) {
        output_local._4_4_ = 0;
      }
      else {
        i._0_4_ = bech32_polymod_step((uint32_t)i);
        data_local = (uint8_t *)hrp;
        hrp_local = output;
        while (*data_local != '\0') {
          uVar2 = bech32_polymod_step((uint32_t)i);
          i._0_4_ = uVar2 ^ (int)(char)*data_local & 0x1fU;
          *hrp_local = *data_local;
          data_local = data_local + 1;
          hrp_local = hrp_local + 1;
        }
        *hrp_local = '1';
        data_len_local = (size_t)data;
        for (uStack_48 = 0; hrp_local = hrp_local + 1, uStack_48 < data_len;
            uStack_48 = uStack_48 + 1) {
          if ((int)(uint)*(byte *)data_len_local >> 5 != 0) {
            return 0;
          }
          uVar2 = bech32_polymod_step((uint32_t)i);
          i._0_4_ = uVar2 ^ *(byte *)data_len_local;
          *hrp_local = charset[*(byte *)data_len_local];
          data_len_local = data_len_local + 1;
        }
        for (uStack_48 = 0; uStack_48 < 6; uStack_48 = uStack_48 + 1) {
          i._0_4_ = bech32_polymod_step((uint32_t)i);
        }
        uVar3 = 1;
        if (is_bech32m) {
          uVar3 = 0x2bc830a3;
        }
        for (uStack_48 = 0; uStack_48 < 6; uStack_48 = uStack_48 + 1) {
          *hrp_local = charset[(uVar3 ^ (uint32_t)i) >>
                               (('\x05' - (char)uStack_48) * '\x05' & 0x1fU) & 0x1f];
          hrp_local = hrp_local + 1;
        }
        *hrp_local = '\0';
        output_local._4_4_ = 1;
      }
      return output_local._4_4_;
    }
    iVar1 = (int)hrp[uStack_48];
    if ((iVar1 < 0x21) || (0x7e < iVar1)) break;
    if ((0x40 < iVar1) && (iVar1 < 0x5b)) {
      return 0;
    }
    uVar2 = bech32_polymod_step((uint32_t)i);
    i._0_4_ = uVar2 ^ iVar1 >> 5;
    uStack_48 = uStack_48 + 1;
  }
  return 0;
}

Assistant:

static int bech32_encode(char *output, const char *hrp, const uint8_t *data, size_t data_len, size_t max_input_len, bool is_bech32m) {
    uint32_t chk = 1;
    size_t i = 0;
    while (hrp[i] != 0) {
        int ch = hrp[i];
        if (ch < 33 || ch > 126) {
            return 0;
        }

        if (ch >= 'A' && ch <= 'Z') return 0;
        chk = bech32_polymod_step(chk) ^ (ch >> 5);
        ++i;
    }
    if (i + 7 + data_len > max_input_len) return 0;
    chk = bech32_polymod_step(chk);
    while (*hrp != 0) {
        chk = bech32_polymod_step(chk) ^ (*hrp & 0x1f);
        *(output++) = *(hrp++);
    }
    *(output++) = '1';
    for (i = 0; i < data_len; ++i) {
        if (*data >> 5) return 0;
        chk = bech32_polymod_step(chk) ^ (*data);
        *(output++) = charset[*(data++)];
    }
    for (i = 0; i < 6; ++i) {
        chk = bech32_polymod_step(chk);
    }
    chk ^= (is_bech32m) ? 0x2bc830a3 : 1;
    for (i = 0; i < 6; ++i) {
        *(output++) = charset[(chk >> ((5 - i) * 5)) & 0x1f];
    }
    *output = 0;
    return 1;
}